

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void PurgeWord2000Attributes(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  Attribute *pAVar2;
  Dict *pDVar3;
  int iVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  AttVal *av;
  
  if (node->attributes != (AttVal *)0x0) {
    pAVar6 = (AttVal *)0x0;
    av = node->attributes;
    do {
      pAVar1 = av->next;
      if ((((av->dict == (Attribute *)0x0) || (av->dict->id != TidyAttr_CLASS)) ||
          (((av->value == (ctmbstr)0x0 ||
            (iVar4 = prvTidytmbstrcasecmp(av->value,"Code"), iVar4 != 0)) &&
           (iVar4 = prvTidytmbstrncmp(av->value,"Mso",3), iVar4 == 0)))) &&
         (((pAVar2 = av->dict, pAVar2 != (Attribute *)0x0 &&
           ((pAVar2->id == TidyAttr_CLASS ||
            ((pAVar2 != (Attribute *)0x0 &&
             ((pAVar2->id == TidyAttr_STYLE ||
              ((pAVar2 != (Attribute *)0x0 &&
               ((pAVar2->id == TidyAttr_LANG ||
                ((((pAVar2 != (Attribute *)0x0 &&
                   ((pAVar2->id == TidyAttr_HEIGHT ||
                    ((pAVar2 != (Attribute *)0x0 && (pAVar2->id == TidyAttr_WIDTH)))))) &&
                  (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) &&
                 ((pDVar3->id == TidyTag_TD ||
                  ((pDVar3 != (Dict *)0x0 &&
                   ((pDVar3->id == TidyTag_TR ||
                    ((pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_TH)))))))))))))))))))))) ||
          ((av->attribute != (ctmbstr)0x0 &&
           (iVar4 = prvTidytmbstrncmp(av->attribute,"x:",2), iVar4 == 0)))))) {
        pAVar5 = pAVar6;
        if (pAVar6 == (AttVal *)0x0) {
          pAVar5 = (AttVal *)&node->attributes;
        }
        pAVar5->next = pAVar1;
        prvTidyFreeAttribute(doc,av);
        av = pAVar6;
      }
      pAVar6 = av;
      av = pAVar1;
    } while (pAVar1 != (AttVal *)0x0);
  }
  return;
}

Assistant:

static void PurgeWord2000Attributes( TidyDocImpl* doc, Node* node )
{
    AttVal *attr, *next, *prev = NULL;

    for ( attr = node->attributes; attr; attr = next )
    {
        next = attr->next;

        /* special check for class="Code" denoting pre text */
        /* Pass thru user defined styles as HTML class names */
        if (attrIsCLASS(attr))
        {
            if (AttrValueIs(attr, "Code") ||
                 TY_(tmbstrncmp)(attr->value, "Mso", 3) != 0 )
            {
                prev = attr;
                continue;
            }
        }

        if (attrIsCLASS(attr) ||
            attrIsSTYLE(attr) ||
            attrIsLANG(attr)  ||
             ( (attrIsHEIGHT(attr) || attrIsWIDTH(attr)) &&
               (nodeIsTD(node) || nodeIsTR(node) || nodeIsTH(node)) ) ||
             (attr->attribute && TY_(tmbstrncmp)(attr->attribute, "x:", 2) == 0) )
        {
            if (prev)
                prev->next = next;
            else
                node->attributes = next;

            TY_(FreeAttribute)( doc, attr );
        }
        else
            prev = attr;
    }
}